

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_statemach_act(connectdata *conn)

{
  _Bool local_49;
  size_t local_40;
  size_t nread;
  pingpong *pp;
  imap_conn *imapc;
  curl_socket_t local_20;
  int imapcode;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  
  imapcode = 0;
  local_20 = conn->sock[0];
  nread = (size_t)&conn->proto;
  local_40 = 0;
  pp = (pingpong *)nread;
  _sock = conn;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    conn_local._4_4_ = imap_perform_upgrade_tls(conn);
  }
  else if ((conn->proto).ftpc.pp.sendleft == 0) {
    do {
      imapcode = Curl_pp_readresp(local_20,(pingpong *)nread,(int *)((long)&imapc + 4),&local_40);
      if (imapcode != CURLE_OK) {
        return imapcode;
      }
      if (imapc._4_4_ == -1) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (imapc._4_4_ == 0) break;
      switch(*(undefined4 *)&pp[1].cache) {
      case 1:
        imapcode = imap_state_servergreet_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 2:
        imapcode = imap_state_capability_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 3:
        imapcode = imap_state_starttls_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 5:
        imapcode = imap_state_auth_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 6:
        imapcode = imap_state_login_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 7:
        imapcode = imap_state_listsearch_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 8:
        imapcode = imap_state_select_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 9:
        imapcode = imap_state_fetch_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 10:
        imapcode = imap_state_fetch_final_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 0xb:
        imapcode = imap_state_append_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 0xc:
        imapcode = imap_state_append_final_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 0xd:
        imapcode = imap_state_listsearch_resp(_sock,imapc._4_4_,*(imapstate *)&pp[1].cache);
        break;
      case 0xe:
      default:
        state(_sock,IMAP_STOP);
      }
      local_49 = false;
      if ((imapcode == 0) && (local_49 = false, *(int *)&pp[1].cache != 0)) {
        local_49 = Curl_pp_moredata((pingpong *)nread);
      }
    } while (local_49 != false);
    conn_local._4_4_ = imapcode;
  }
  else {
    conn_local._4_4_ = Curl_pp_flushsend((pingpong *)nread);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}